

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqFactoring.cpp
# Opt level: O0

ClauseIterator __thiscall
Inferences::ALASCA::EqFactoring::generateClauses(EqFactoring *this,Clause *premise)

{
  element_type *this_00;
  IteratorCore<Kernel::Clause_*> *in_RDI;
  shared_ptr<Lib::Stack<Kernel::SelectedEquality>_> rest;
  shared_ptr<Lib::Stack<Kernel::SelectedEquality>_> selected;
  shared_ptr<Lib::Stack<Kernel::SelectedEquality>_> *in_stack_fffffffffffffa88;
  Stack<Kernel::SelectedEquality> *in_stack_fffffffffffffa90;
  anon_class_40_3_3e9c2264_for__func *this_01;
  element_type *in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffacc;
  element_type *in_stack_fffffffffffffad0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffb37;
  SelectionCriterion in_stack_fffffffffffffb38;
  SelectionCriterion in_stack_fffffffffffffb3c;
  Clause *in_stack_fffffffffffffb40;
  AlascaState *in_stack_fffffffffffffb48;
  IterTraits<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>_>
  *in_stack_fffffffffffffba8;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>_>_>
  *in_stack_fffffffffffffbb8;
  undefined1 local_3f0 [64];
  anon_class_40_3_3e9c2264_for__func *in_stack_fffffffffffffc50;
  IterTraits<Lib::RangeIterator<unsigned_long>_> *in_stack_fffffffffffffc58;
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>_>
  local_338;
  undefined1 local_1f8 [184];
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>_>
  local_140;
  
  std::__shared_ptr_access<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5d3682);
  Kernel::AlascaState::selectedEqualities
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
             in_stack_fffffffffffffb38,(bool)in_stack_fffffffffffffb37);
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1}>(unsigned_int,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1},Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1)#1},Kernel::SelectedLiteral>,Kernel::AlascaState::selectedActivePositions(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1},Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>>>>,Kernel::AlascaState::selectedEqualities(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>>
  ::filter<Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__1>
            (&local_140,local_1f8);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>_>
  ::collect<Lib::Stack>
            ((IterTraits<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>_>
              *)in_stack_fffffffffffffba8);
  Lib::make_shared<Lib::Stack<Kernel::SelectedEquality>,_true>
            ((Stack<Kernel::SelectedEquality> *)in_stack_fffffffffffffad8._M_pi);
  Lib::Stack<Kernel::SelectedEquality>::~Stack(in_stack_fffffffffffffa90);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>_>
  ::~IterTraits((IterTraits<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>_>
                 *)0x5d3706);
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>_>
  ::~IterTraits((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>_>
                 *)0x5d3713);
  std::__shared_ptr_access<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5d3721);
  Kernel::AlascaState::selectedEqualities
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
             in_stack_fffffffffffffb38,(bool)in_stack_fffffffffffffb37);
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1}>(unsigned_int,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1},Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1)#1},Kernel::SelectedLiteral>,Kernel::AlascaState::selectedActivePositions(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1},Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>>>>,Kernel::AlascaState::selectedEqualities(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>>
  ::filter<Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__2>
            (&local_338,local_3f0);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>_>
  ::collect<Lib::Stack>(in_stack_fffffffffffffba8);
  Lib::make_shared<Lib::Stack<Kernel::SelectedEquality>,_true>
            ((Stack<Kernel::SelectedEquality> *)in_stack_fffffffffffffad8._M_pi);
  Lib::Stack<Kernel::SelectedEquality>::~Stack(in_stack_fffffffffffffa90);
  Lib::
  IterTraits<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>_>
  ::~IterTraits((IterTraits<Lib::FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>_>
                 *)0x5d37a5);
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>_>
  ::~IterTraits((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>_>
                 *)0x5d37b2);
  this_00 = std::
            __shared_ptr_access<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x5d37bf);
  Lib::Stack<Kernel::SelectedEquality>::size(this_00);
  Lib::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
             (unsigned_long)in_stack_fffffffffffffac0);
  this_01 = (anon_class_40_3_3e9c2264_for__func *)&stack0xfffffffffffffac0;
  std::shared_ptr<Lib::Stack<Kernel::SelectedEquality>_>::shared_ptr
            ((shared_ptr<Lib::Stack<Kernel::SelectedEquality>_> *)this_01,in_stack_fffffffffffffa88)
  ;
  std::shared_ptr<Lib::Stack<Kernel::SelectedEquality>_>::shared_ptr
            (&this_01->selected,in_stack_fffffffffffffa88);
  Lib::IterTraits<Lib::RangeIterator<unsigned_long>>::
  flatMap<Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0>
            (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  Lib::operator()(in_stack_fffffffffffffbb8);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:171:19),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>_>_>
                 *)0x5d384c);
  generateClauses(Kernel::Clause*)::$_0::~__0(this_01);
  std::shared_ptr<Lib::Stack<Kernel::SelectedEquality>_>::~shared_ptr
            ((shared_ptr<Lib::Stack<Kernel::SelectedEquality>_> *)0x5d3863);
  std::shared_ptr<Lib::Stack<Kernel::SelectedEquality>_>::~shared_ptr
            ((shared_ptr<Lib::Stack<Kernel::SelectedEquality>_> *)0x5d3870);
  return (ClauseIterator)in_RDI;
}

Assistant:

ClauseIterator EqFactoring::generateClauses(Clause* premise) 
{

  TIME_TRACE("alasca equality factoring generate")
  DEBUG("in: ", *premise)

  auto selected = Lib::make_shared(
      _shared->selectedEqualities(premise, 
                       /* literal */ SelectionCriterion::NOT_LESS, 
                       /* summand */ SelectionCriterion::NOT_LEQ,
                       /* include number vars */ false)
        .filter([](auto& s) { return s.positive(); })
        // .filter([](auto& s) { return !s.isFracNum() || !s.biggerSide().isVar(); })
        .template collect<Stack>());

  auto rest = Lib::make_shared(
      _shared->selectedEqualities(premise, 
                       /* literal */ SelectionCriterion::ANY, 
                       /* summand */ SelectionCriterion::NOT_LEQ,
                       /* include number vars */ false)
        .filter([](auto& s) { return s.positive(); })
        // .filter([](auto& s) { return !s.isFracNum() || !s.biggerSide().isVar(); })
        .template collect<Stack>());

  return pvi(range(0, selected->size())
      .flatMap([=](auto i) {
        return range(0, rest->size())
          .filter([=](auto j) { return (*selected)[i].litIdx() != (*rest)[j].litIdx(); })
          // .filter([=](auto j) { return (*selected)[i].numTraits() == (*rest)[j].numTraits(); })
          .flatMap([=](auto j) {
              auto& max = (*selected)[i];
              auto& other = (*rest)[j];
              return ifElseIter(

                  // both literals are the same. 
                  // we use a symmetry breaking index comparison
                  // TODO we could replace this == by _shared.equivalent
                  max.literal() == other.literal() && other.litIdx() < max.litIdx(), 
                  [&]() { return arrayIter(Stack<Clause*>{}); },

                  // only one is selected (= maximal)
                  [&]() { return concatIters(applyRule(other, max).intoIter()); });
          });
      }));
}